

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,vector<iovec,_std::allocator<iovec>_> *iovs,
          uint64_t start_address,vector<iovec,_std::allocator<iovec>_> *prev_iovs,uint64_t flags)

{
  iovec *piVar1;
  iovec *piVar2;
  iovec *start_address_00;
  iovec *prev_iovs_00;
  uint64_t in_stack_ffffffffffffff90;
  uint64_t flags_local;
  vector<iovec,_std::allocator<iovec>_> *prev_iovs_local;
  uint64_t start_address_local;
  vector<iovec,_std::allocator<iovec>_> *iovs_local;
  
  if (start_address == 0) {
    piVar1 = ::std::vector<iovec,_std::allocator<iovec>_>::data
                       ((vector<iovec,_std::allocator<iovec>_> *)this);
    piVar2 = (iovec *)::std::vector<iovec,_std::allocator<iovec>_>::size
                                ((vector<iovec,_std::allocator<iovec>_> *)this);
    format_data_abi_cxx11_
              (__return_storage_ptr__,(phosg *)piVar1,piVar2,(size_t)iovs,0,(iovec *)0x0,
               (size_t)prev_iovs,in_stack_ffffffffffffff90);
  }
  else {
    piVar1 = ::std::vector<iovec,_std::allocator<iovec>_>::data
                       ((vector<iovec,_std::allocator<iovec>_> *)this);
    piVar2 = (iovec *)::std::vector<iovec,_std::allocator<iovec>_>::size
                                ((vector<iovec,_std::allocator<iovec>_> *)this);
    start_address_00 =
         ::std::vector<iovec,_std::allocator<iovec>_>::data
                   ((vector<iovec,_std::allocator<iovec>_> *)start_address);
    prev_iovs_00 = (iovec *)::std::vector<iovec,_std::allocator<iovec>_>::size
                                      ((vector<iovec,_std::allocator<iovec>_> *)start_address);
    format_data_abi_cxx11_
              (__return_storage_ptr__,(phosg *)piVar1,piVar2,(size_t)iovs,(uint64_t)start_address_00
               ,prev_iovs_00,(size_t)prev_iovs,in_stack_ffffffffffffff90);
  }
  return __return_storage_ptr__;
}

Assistant:

string format_data(
    const vector<struct iovec>& iovs,
    uint64_t start_address,
    const vector<struct iovec>* prev_iovs,
    uint64_t flags) {
  if (prev_iovs) {
    return format_data(iovs.data(), iovs.size(), start_address, prev_iovs->data(), prev_iovs->size(), flags);
  } else {
    return format_data(iovs.data(), iovs.size(), start_address, nullptr, 0, flags);
  }
}